

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_haxe_generator.cc
# Opt level: O2

string * __thiscall
t_haxe_generator::function_signature_combined_abi_cxx11_
          (string *__return_storage_ptr__,t_haxe_generator *this,t_function *tfunction)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  string arguments;
  string local_e0;
  string resulttype;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string on_error_success;
  
  generate_service_method_onsuccess_abi_cxx11_(&arguments,this,tfunction,true,false);
  std::operator+(&on_error_success,"onError : Dynamic->Void = null, ",&arguments);
  std::__cxx11::string::~string((string *)&arguments);
  argument_list_abi_cxx11_(&arguments,this,tfunction->arglist_);
  bVar2 = tfunction->oneway_;
  if ((bool)bVar2 == false) {
    bVar1 = std::operator!=(&arguments,"");
    if (bVar1) {
      std::__cxx11::string::append((char *)&arguments);
    }
    std::__cxx11::string::append((string *)&arguments);
    bVar2 = tfunction->oneway_;
  }
  resulttype._M_dataplus._M_p = (pointer)&resulttype.field_2;
  resulttype._M_string_length = 0;
  resulttype.field_2._M_local_buf[0] = '\0';
  if ((bVar2 & 1) == 0) {
    iVar3 = (*(tfunction->returntype_->super_t_doc)._vptr_t_doc[4])();
    if ((char)iVar3 == '\0') {
      type_name_abi_cxx11_(&local_e0,this,tfunction->returntype_,false,false);
      std::__cxx11::string::operator=((string *)&resulttype,(string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      goto LAB_001e6633;
    }
  }
  std::__cxx11::string::assign((char *)&resulttype);
LAB_001e6633:
  std::operator+(&local_a0,"function ",&tfunction->name_);
  std::operator+(&local_80,&local_a0,"(");
  std::operator+(&local_60,&local_80,&arguments);
  std::operator+(&local_e0,&local_60,") : ");
  std::operator+(__return_storage_ptr__,&local_e0,&resulttype);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&resulttype);
  std::__cxx11::string::~string((string *)&arguments);
  std::__cxx11::string::~string((string *)&on_error_success);
  return __return_storage_ptr__;
}

Assistant:

string t_haxe_generator::function_signature_combined(t_function* tfunction) {
  std::string on_error_success = "onError : Dynamic->Void = null, "
                                 + generate_service_method_onsuccess(tfunction, true, false);

  std::string arguments = argument_list(tfunction->get_arglist());
  if (!tfunction->is_oneway()) {
    if (arguments != "") {
      arguments += ", ";
    }
    arguments += on_error_success; //"onError : Function, onSuccess : Function";
  }

  std::string resulttype;
  if (tfunction->is_oneway() || tfunction->get_returntype()->is_void()) {
    resulttype = "Void";
  } else {
    resulttype = type_name(tfunction->get_returntype());
  }

  std::string result = "function " + tfunction->get_name() + "(" + arguments + ") : "+resulttype;
  return result;
}